

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_DrawSplash(int count,DVector3 *pos,DAngle *angle,int kind)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  particle_t *ppVar6;
  double dVar7;
  int local_44;
  particle_t *p;
  int color2;
  int color1;
  int kind_local;
  DAngle *angle_local;
  DVector3 *pos_local;
  int count_local;
  
  iVar3 = yorange;
  iVar2 = orange;
  pos_local._4_4_ = count;
  if (kind == 1) {
    while ((pos_local._4_4_ != 0 && (ppVar6 = JitterParticle(10), ppVar6 != (particle_t *)0x0))) {
      ppVar6->size = 2.0;
      uVar4 = FRandom::operator()(&M_Random);
      if ((uVar4 & 0x80) == 0) {
        local_44 = iVar3;
      }
      else {
        local_44 = iVar2;
      }
      ppVar6->color = local_44;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar6->Vel).Z = (ppVar6->Vel).Z - (double)iVar5 / 128.0;
      (ppVar6->Acc).Z = (ppVar6->Acc).Z - 0.125;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar6->Acc).X = (double)(iVar5 + -0x80) / 8192.0 + (ppVar6->Acc).X;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar6->Acc).Y = (double)(iVar5 + -0x80) / 8192.0 + (ppVar6->Acc).Y;
      dVar1 = pos->Z;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar6->Pos).Z = dVar1 - (double)iVar5 / 64.0;
      iVar5 = FRandom::operator()(&M_Random);
      TAngle<double>::operator+=(angle,(double)iVar5 * 0.17578125);
      dVar1 = pos->X;
      uVar4 = FRandom::operator()(&M_Random);
      dVar7 = TAngle<double>::Cos(angle);
      (ppVar6->Pos).X = dVar1 + (double)(uVar4 & 0xf) * dVar7;
      dVar1 = pos->Y;
      uVar4 = FRandom::operator()(&M_Random);
      dVar7 = TAngle<double>::Sin(angle);
      (ppVar6->Pos).Y = dVar1 + (double)(uVar4 & 0xf) * dVar7;
      pos_local._4_4_ = pos_local._4_4_ + -1;
    }
  }
  return;
}

Assistant:

void P_DrawSplash (int count, const DVector3 &pos, DAngle angle, int kind)
{
	int color1, color2;

	switch (kind)
	{
	case 1:		// Spark
		color1 = orange;
		color2 = yorange;
		break;
	default:
		return;
	}

	for (; count; count--)
	{
		particle_t *p = JitterParticle (10);

		if (!p)
			break;

		p->size = 2;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z -= M_Random () / 128.;
		p->Acc.Z -= 1./8;
		p->Acc.X += (M_Random () - 128) / 8192.;
		p->Acc.Y += (M_Random () - 128) / 8192.;
		p->Pos.Z = pos.Z - M_Random () / 64.;
		angle += M_Random() * (45./256);
		p->Pos.X = pos.X + (M_Random() & 15)*angle.Cos();
		p->Pos.Y = pos.Y + (M_Random() & 15)*angle.Sin();
	}
}